

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  IMutableContext *pIVar2;
  char *pcVar3;
  undefined **ppuVar4;
  Ptr<const_Catch::IConfig> local_20;
  
  if (use(Catch::Colour::Code)::impl != '\0') goto LAB_001370fd;
  iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
  if (iVar1 == 0) goto LAB_001370fd;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_20,pIVar2);
  if (local_20.m_p == (IConfig *)0x0) {
LAB_00137155:
    iVar1 = isatty(1);
    if (iVar1 != 0) goto LAB_00137161;
LAB_00137174:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance == '\0') {
      pcVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
      ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_001371d5;
    }
    ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar1 = (*((local_20.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])();
    if (iVar1 != 1) {
      if (iVar1 == 0) goto LAB_00137155;
      goto LAB_00137174;
    }
LAB_00137161:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance == '\0') {
      pcVar3 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
LAB_001371d5:
      if (iVar1 != 0) {
        __cxa_guard_release(pcVar3);
      }
    }
    else {
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    }
  }
  Ptr<const_Catch::IConfig>::~Ptr(&local_20);
  use::impl = (IColourImpl *)ppuVar4;
  __cxa_guard_release(&use(Catch::Colour::Code)::impl);
LAB_001370fd:
  (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = platformColourInstance();
        impl->use( _colourCode );
    }